

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O2

Nurse * __thiscall
Hospital::Entered_Nurse
          (Hospital *this,string *username,string *password,
          vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses)

{
  __type _Var1;
  pointer pNVar2;
  long lVar3;
  ulong uVar4;
  string local_70;
  string local_50;
  
  lVar3 = 0;
  uVar4 = 0;
  do {
    pNVar2 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pNVar2) / 0x158) <= uVar4) {
      uVar4 = 0;
LAB_00115ff3:
      return pNVar2 + uVar4;
    }
    Human::User_name_Getter_abi_cxx11_
              (&local_70,(Human *)((long)&(pNVar2->super_Human).Id._M_dataplus + lVar3));
    _Var1 = std::operator==(&local_70,username);
    if (_Var1) {
      Human::Password_Getter_abi_cxx11_
                (&local_50,
                 (Human *)((long)&(((All_Of_Nurses->
                                    super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                                    super__Vector_impl_data._M_start)->super_Human).Id._M_dataplus +
                          lVar3));
      _Var1 = std::operator==(&local_50,password);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      if (_Var1) {
        pNVar2 = (All_Of_Nurses->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_00115ff3;
      }
    }
    else {
      std::__cxx11::string::~string((string *)&local_70);
    }
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0x158;
  } while( true );
}

Assistant:

Nurse* Hospital :: Entered_Nurse(string username , string password , vector<Nurse> & All_Of_Nurses){
    int g =0;
    for (int i = 0; i < All_Of_Nurses.size(); ++i) {
        if (All_Of_Nurses[i].User_name_Getter() == username && All_Of_Nurses[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }
    return &All_Of_Nurses[g];
}